

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionController::InsertUnlockingScript
          (TransactionController *this,Txid *txid,uint32_t vout,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_scripts)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RCX;
  uint in_ESI;
  long in_RDI;
  Txid *this_00;
  ByteData *data;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2_1;
  ScriptElement *element;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range2;
  ScriptBuilder builder;
  Script script;
  uint32_t txin_index;
  AbstractTxInReference *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 uVar4;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_168;
  undefined8 local_160;
  reference local_158;
  ScriptElement *local_150;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_148;
  undefined1 local_140 [24];
  undefined1 *local_128;
  ByteData local_120 [2];
  undefined1 local_f0 [204];
  uint local_24;
  undefined8 local_20;
  
  this_00 = (Txid *)(in_RDI + 0x10);
  local_20 = in_RCX;
  local_24 = cfd::core::Transaction::GetTxInIndex(this_00,in_ESI);
  cfd::core::Transaction::GetTxIn((uint)local_f0);
  core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffe28);
  core::TxInReference::~TxInReference((TxInReference *)0x3b3996);
  bVar1 = cfd::core::Script::IsEmpty();
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe34);
  if ((bVar1 & 1) == 0) {
    core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x3b3a23);
    cfd::core::Script::GetElementList();
    local_128 = local_140;
    local_148._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                   ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    in_stack_fffffffffffffe28);
    local_150 = (ScriptElement *)
                std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                end((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                    in_stack_fffffffffffffe28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                          *)CONCAT44(uVar4,in_stack_fffffffffffffe30),
                         (__normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                          *)in_stack_fffffffffffffe28);
      if (!bVar2) break;
      local_158 = __gnu_cxx::
                  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                  ::operator*(&local_148);
      cfd::core::ScriptBuilder::AppendElement((ScriptElement *)local_120);
      __gnu_cxx::
      __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
      ::operator++(&local_148);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               this_00);
    local_160 = local_20;
    local_168._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                   ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                    in_stack_fffffffffffffe28);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffffe28);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                          *)CONCAT44(uVar4,in_stack_fffffffffffffe30),
                         (__normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                          *)in_stack_fffffffffffffe28);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator*(&local_168);
      cfd::core::ScriptBuilder::AppendData(local_120);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator++(&local_168);
    }
    uVar3 = (int)in_RDI + 0x10;
    in_stack_fffffffffffffe30 = local_24;
    cfd::core::ScriptBuilder::Build();
    cfd::core::Transaction::SetUnlockingScript(uVar3,(Script *)(ulong)in_stack_fffffffffffffe30);
    core::Script::~Script((Script *)CONCAT44(uVar4,in_stack_fffffffffffffe30));
    core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x3b3be2);
  }
  else {
    cfd::core::Transaction::SetUnlockingScript((int)in_RDI + 0x10,(vector *)(ulong)local_24);
  }
  core::Script::~Script((Script *)CONCAT44(uVar4,in_stack_fffffffffffffe30));
  return;
}

Assistant:

void TransactionController::InsertUnlockingScript(
    const Txid& txid, uint32_t vout,
    const std::vector<ByteData>& unlocking_scripts) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  Script script = transaction_.GetTxIn(txin_index).GetUnlockingScript();
  if (script.IsEmpty()) {
    transaction_.SetUnlockingScript(txin_index, unlocking_scripts);
  } else {
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const ByteData& data : unlocking_scripts) {
      builder.AppendData(data);
    }
    transaction_.SetUnlockingScript(txin_index, builder.Build());
  }
}